

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *
LiteScript::Instruction::LoadBinary
          (vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
           *__return_storage_ptr__,istream *stream)

{
  byte bVar1;
  long lVar2;
  void *__dest;
  void *__src;
  bool bVar3;
  undefined1 local_78 [8];
  Instruction instr;
  uint local_60;
  uint i;
  uint sz;
  uchar c_tmp;
  string s_tmp;
  IStreamer local_28;
  IStreamer streamer;
  istream *stream_local;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *res;
  
  streamer.stream._7_1_ = 0;
  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::vector
            (__return_storage_ptr__);
  IStreamer::IStreamer(&local_28,stream);
  std::__cxx11::string::string((string *)&sz);
  IStreamer::operator>>(&local_28,&local_60);
  for (instr.comp_value._4_4_ = 0; instr.comp_value._4_4_ < local_60;
      instr.comp_value._4_4_ = instr.comp_value._4_4_ + 1) {
    Instruction((Instruction *)local_78);
    IStreamer::operator>>(&local_28,local_78);
    IStreamer::operator>>(&local_28,local_78 + 1);
    switch(local_78[1]) {
    case '\x01':
      std::istream::operator>>((istream *)stream,(bool *)&instr);
      break;
    case '\x02':
      IStreamer::operator>>(&local_28,(int *)&instr);
      break;
    case '\x03':
      IStreamer::operator>>(&local_28,(float *)&instr);
      break;
    case '\x04':
      std::__cxx11::string::clear();
      while( true ) {
        bVar1 = std::ios::eof();
        bVar3 = false;
        if ((bVar1 & 1) == 0) {
          i._3_1_ = std::istream::get();
          bVar3 = i._3_1_ != '\0';
        }
        if (!bVar3) break;
        std::__cxx11::string::operator+=((string *)&sz,i._3_1_);
      }
      lVar2 = std::__cxx11::string::size();
      __dest = operator_new__(lVar2 + 1);
      instr._0_8_ = __dest;
      __src = (void *)std::__cxx11::string::c_str();
      lVar2 = std::__cxx11::string::size();
      memcpy(__dest,__src,lVar2 + 1);
      break;
    default:
      local_78[1] = '\0';
    }
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
              (__return_storage_ptr__,(value_type *)local_78);
    ~Instruction((Instruction *)local_78);
  }
  streamer.stream._7_1_ = 1;
  std::__cxx11::string::~string((string *)&sz);
  if ((streamer.stream._7_1_ & 1) == 0) {
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LiteScript::Instruction> LiteScript::Instruction::LoadBinary(std::istream &stream) {
    std::vector<Instruction> res;
    IStreamer streamer(stream);
    std::string s_tmp;
    unsigned char c_tmp;
    unsigned int sz;
    streamer >> sz;
    for (unsigned int i = 0; i < sz; i++) {
        Instruction instr;
        streamer >> instr.code;
        streamer >> instr.comp_type;
        switch (instr.comp_type) {
            case CompType::COMP_TYPE_BOOLEAN:
                stream >> instr.comp_value.v_boolean;
                break;
            case CompType::COMP_TYPE_INTEGER:
                streamer >> instr.comp_value.v_integer;
                break;
            case CompType::COMP_TYPE_FLOAT:
                streamer >> instr.comp_value.v_float;
                break;
            case CompType::COMP_TYPE_STRING:
                s_tmp.clear();
                while (!stream.eof() && (c_tmp = (unsigned char)stream.get()) != 0)
                    s_tmp += c_tmp;
                instr.comp_value.v_string = new char[s_tmp.size() + 1];
                memcpy(instr.comp_value.v_string, s_tmp.c_str(), s_tmp.size() + 1);
                break;
            default:
                instr.comp_type = 0;
        }
        res.push_back(instr);
    }
    return res;
}